

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void fmt::v11::detail::vformat_to(buffer<char> *buf,string_view fmt,format_args args,locale_ref loc)

{
  bool bVar1;
  format_handler<char> *pfVar2;
  format_handler<char> *handler;
  char *pcVar3;
  detail *this;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar4;
  basic_string_view<char> fmt_00;
  format_arg arg;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 local_78;
  type local_68;
  buffer<char> *local_60;
  format_handler<char> *local_58;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_50;
  void *local_48;
  default_arg_formatter<char> local_38;
  
  aVar4 = args.field_1;
  pfVar2 = (format_handler<char> *)args.desc_;
  pcVar3 = (char *)fmt.size_;
  this = (detail *)fmt.data_;
  handler = pfVar2;
  if ((pcVar3 != (char *)0x2) || (bVar1 = equal2((char *)this,"{}"), !bVar1)) {
    local_68 = 0;
    fmt_00.size_ = (size_t)&local_78;
    fmt_00.data_ = pcVar3;
    local_78.named_args.data = (named_arg_info<char> *)this;
    local_78.string.size = (size_t)pcVar3;
    local_60 = buf;
    local_58 = pfVar2;
    local_50 = aVar4;
    local_48 = loc.locale_;
    parse_format_string<char,fmt::v11::detail::format_handler<char>>(this,fmt_00,handler);
    return;
  }
  local_68 = none_type;
  if ((long)pfVar2 < 0) {
    if ((int)(type)args.desc_ < 1) goto LAB_001b1531;
    local_68 = (aVar4.args_)->type_;
  }
  else {
    local_68 = (type)args.desc_ & custom_type;
    if (((undefined1  [16])args & (undefined1  [16])0xf) == (undefined1  [16])0x0)
    goto LAB_001b1531;
  }
  local_78.long_long_value = ((aVar4.values_)->field_0).long_long_value;
  local_78.string.size = ((aVar4.values_)->field_0).string.size;
LAB_001b1531:
  local_38.out.container = (basic_appender<char>)(basic_appender<char>)buf;
  basic_format_arg<fmt::v11::context>::visit<fmt::v11::detail::default_arg_formatter<char>>
            ((basic_format_arg<fmt::v11::context> *)&local_78.string,&local_38);
  return;
}

Assistant:

FMT_FUNC void vformat_to(buffer<char>& buf, string_view fmt, format_args args,
                         locale_ref loc) {
  auto out = appender(buf);
  if (fmt.size() == 2 && equal2(fmt.data(), "{}"))
    return args.get(0).visit(default_arg_formatter<char>{out});
  parse_format_string(
      fmt, format_handler<char>{parse_context<char>(fmt), {out, args, loc}});
}